

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeLateCustomSections(WasmBinaryWriter *this)

{
  bool bVar1;
  vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *this_00;
  reference section_00;
  CustomSection *section;
  iterator __end1;
  iterator __begin1;
  vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *__range1;
  WasmBinaryWriter *this_local;
  
  this_00 = &this->wasm->customSections;
  __end1 = std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::begin(this_00);
  section = (CustomSection *)
            std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
                                     *)&section), bVar1) {
    section_00 = __gnu_cxx::
                 __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
                 ::operator*(&__end1);
    bVar1 = std::operator!=(&section_00->name,BinaryConsts::CustomSections::Dylink);
    if (bVar1) {
      writeCustomSection(this,section_00);
    }
    __gnu_cxx::
    __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeLateCustomSections() {
  for (auto& section : wasm->customSections) {
    if (section.name != BinaryConsts::CustomSections::Dylink) {
      writeCustomSection(section);
    }
  }
}